

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singly_linked_list.cpp
# Opt level: O3

SinglyNodeWithRand *
si9ma::SinglyLinkedList::common_loop_intersection
          (SinglyNodeWithRand *head1,SinglyNodeWithRand *head2,SinglyNodeWithRand *list_terminal)

{
  SinglyNodeWithRand **ppSVar1;
  SinglyNodeWithRand *pSVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  SinglyNodeWithRand *ptr;
  
  iVar3 = 0;
  pSVar2 = head1;
  if (head1 != list_terminal) {
    do {
      iVar3 = iVar3 + 1;
      ppSVar1 = &pSVar2->next;
      pSVar2 = *ppSVar1;
    } while (*ppSVar1 != list_terminal);
  }
  pSVar2 = head2;
  if (head2 != list_terminal) {
    do {
      iVar3 = iVar3 + -1;
      ppSVar1 = &pSVar2->next;
      pSVar2 = *ppSVar1;
    } while (*ppSVar1 != list_terminal);
  }
  pSVar2 = head1;
  if (0 < iVar3) {
    pSVar2 = head2;
    head2 = head1;
  }
  if (iVar3 != 0) {
    iVar4 = -iVar3;
    if (iVar3 != iVar4 && SBORROW4(iVar3,iVar4) == iVar3 * 2 < 0) {
      iVar4 = iVar3;
    }
    uVar5 = iVar4 + 1;
    do {
      head2 = head2->next;
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
  }
  for (; head2 != pSVar2; head2 = head2->next) {
    pSVar2 = pSVar2->next;
  }
  return head2;
}

Assistant:

SinglyNodeWithRand* SinglyLinkedList::common_loop_intersection(si9ma::SinglyNodeWithRand *head1, si9ma::SinglyNodeWithRand *head2, si9ma::SinglyNodeWithRand *list_terminal) {
        int len = 0;

        auto *ptr = head1;
        while (ptr != list_terminal){
            len ++;
            ptr = ptr->next;
        }

        ptr = head2;
        while (ptr != list_terminal){
            len --;
            ptr = ptr->next;
        }

        auto *long_list = len > 0 ? head1 : head2;
        auto *short_list = len > 0 ? head2 : head1;
        int diff = abs(len);

        while (diff-- > 0)
            long_list = long_list->next;

        while (long_list != short_list){
            long_list = long_list->next;
            short_list = short_list->next;
        }

        return long_list;
    }